

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::Element(cmXMLWriter *this,char *name)

{
  ostream *poVar1;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar1 = std::operator<<(this->Output,'<');
  poVar1 = std::operator<<(poVar1,name);
  std::operator<<(poVar1,"/>");
  return;
}

Assistant:

void cmXMLWriter::Element(const char* name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << '<' << name << "/>";
}